

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O3

Matrix3x3 *
iDynTree::Rotation::leftJacobianInverse
          (Matrix3x3 *__return_storage_ptr__,AngularMotionVector3 *omega)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  PointerType ptr;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double norm;
  Vector3 phi;
  Matrix3x3 phi_cross;
  assign_op<double,_double> local_189;
  double local_188;
  double local_180;
  undefined1 local_178 [16];
  double local_168;
  double local_158;
  undefined8 uStack_150;
  Matrix<double,__1,__1,_0,__1,__1> local_148;
  undefined8 local_128;
  double dStack_120;
  ulong local_118;
  double dStack_110;
  undefined8 local_108;
  ulong uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  undefined8 local_e8;
  undefined1 local_e0 [152];
  scalar_constant_op<double> local_48;
  undefined1 *local_40;
  undefined1 *local_28;
  
  dVar2 = (omega->super_Vector3).m_data[0];
  dVar3 = (omega->super_Vector3).m_data[1];
  dVar1 = (omega->super_Vector3).m_data[2];
  local_180 = SQRT(dVar1 * dVar1 + dVar3 * dVar3 + dVar2 * dVar2);
  local_e0._0_8_ = 0.0;
  bVar4 = checkDoublesAreEqual(&local_180,(double *)local_e0,DEFAULT_TOL);
  if (bVar4) {
    __return_storage_ptr__->m_data[0] = 1.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[3] = 0.0;
    __return_storage_ptr__->m_data[4] = 1.0;
    __return_storage_ptr__->m_data[5] = 0.0;
    __return_storage_ptr__->m_data[6] = 0.0;
    __return_storage_ptr__->m_data[7] = 0.0;
    __return_storage_ptr__->m_data[8] = 1.0;
  }
  else {
    local_158 = local_180 * 0.5;
    uStack_150 = 0;
    local_188 = cos(local_158);
    dVar1 = sin(local_158);
    local_e0._40_8_ = (local_188 / dVar1) * local_158;
    local_e0._96_8_ = -local_158;
    local_48.m_other = 1.0 - (double)local_e0._40_8_;
    local_178 = *(undefined1 (*) [16])(omega->super_Vector3).m_data;
    local_168 = (omega->super_Vector3).m_data[2];
    auVar5._0_8_ = local_168 * local_168 +
                   local_178._8_8_ * local_178._8_8_ + local_178._0_8_ * local_178._0_8_;
    if (0.0 < auVar5._0_8_) {
      auVar5._8_8_ = 0;
      auVar5 = sqrtpd(auVar5,auVar5);
      auVar6._0_8_ = auVar5._0_8_;
      local_168 = local_168 / auVar6._0_8_;
      auVar6._8_8_ = auVar6._0_8_;
      local_178 = divpd(local_178,auVar6);
    }
    uStack_f0 = local_178._0_8_;
    local_118 = local_178._8_8_;
    dStack_120 = -local_168;
    uStack_100 = uStack_f0 ^ 0x8000000000000000;
    local_f8 = local_118 ^ 0x8000000000000000;
    local_e0._104_8_ = &local_128;
    local_128 = 0;
    local_108 = 0;
    local_e8 = 0;
    local_e0._24_8_ = 3;
    local_e0._32_8_ = 3;
    local_e0._48_8_ = 3;
    local_e0._56_8_ = 3;
    local_40 = local_178;
    local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    dStack_110 = local_168;
    local_28 = local_40;
    Eigen::internal::
    assignment_from_xpr_op_product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>const>const>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
    ::
    run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>const>const>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>,0>const>,Eigen::internal::assign_op<double,double>>
              (&local_148,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
                *)local_e0,&local_189);
    __return_storage_ptr__->m_data[0] =
         *local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data;
    __return_storage_ptr__->m_data[1] =
         local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         [local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows];
    __return_storage_ptr__->m_data[2] =
         local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         [local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows * 2];
    __return_storage_ptr__->m_data[3] =
         local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         [1];
    __return_storage_ptr__->m_data[4] =
         local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         [local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows + 1];
    __return_storage_ptr__->m_data[5] =
         local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         [local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows * 2 + 1];
    __return_storage_ptr__->m_data[6] =
         local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         [2];
    __return_storage_ptr__->m_data[7] =
         local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         [local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows + 2];
    __return_storage_ptr__->m_data[8] =
         local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         [local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows * 2 + 2];
    free(local_148.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Rotation::leftJacobianInverse(const AngularMotionVector3& omega)
    {
        iDynTree::Matrix3x3 Jinv;
        auto I3 = Eigen::MatrixXd::Identity(3, 3);
        using iDynTree::toEigen;
        double norm = toEigen(omega).norm();

        if (iDynTree::checkDoublesAreEqual(norm, 0.0))
        {
            toEigen(Jinv) = I3;
            return Jinv;
        }

        double normovertwo{norm/2.0};
        double c{std::cos(normovertwo)};
        double s{std::sin(normovertwo)};
        double cot{c/s};

        double alpha1{(normovertwo*cot)};
        double alpha2{(-normovertwo)};
        double alpha3{(1 - alpha1)};

        Vector3 phi;
        toEigen(phi) = toEigen(omega);
        toEigen(phi).normalize();

        Matrix3x3 phi_cross;
        toEigen(phi_cross) = skew(toEigen(phi));

        toEigen(Jinv) = alpha1*I3  + alpha2*toEigen(phi_cross) + alpha3*toEigen(phi)*toEigen(phi).transpose();
        return Jinv;
    }